

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O1

void __thiscall
anurbs::NurbsCurveGeometry<2L>::set_poles
          (NurbsCurveGeometry<2L> *this,
          Ref<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_> *poles)

{
  long rows;
  long lVar1;
  double dVar2;
  long lVar3;
  undefined8 *puVar4;
  double *pdVar5;
  PointerType pdVar6;
  
  pdVar6 = (poles->
           super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_data;
  rows = (poles->
         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_rows.m_value;
  lVar1 = (poles->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_0,_Eigen::OuterStride<_1>_>_>
          ).m_stride.m_outer.m_value;
  if ((this->m_poles).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>.m_storage.
      m_rows != rows) {
    if (rows < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 2>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 2>]"
                   );
    }
    if (0x3fffffffffffffff < rows) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = acos;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_2,_1>::resize
              ((DenseStorage<double,__1,__1,_2,_1> *)&this->m_poles,rows * 2,rows,2);
  }
  lVar3 = (this->m_poles).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>.m_storage.
          m_rows;
  if (lVar3 == rows) {
    if (0 < lVar3) {
      pdVar5 = (this->m_poles).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_1,__1,_2>_>.
               m_storage.m_data;
      do {
        dVar2 = pdVar6[1];
        *pdVar5 = *pdVar6;
        pdVar5[1] = dVar2;
        pdVar6 = pdVar6 + lVar1;
        pdVar5 = pdVar5 + 2;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/AssignEvaluator.h"
                ,0x2d1,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 2>, SrcXprType = Eigen::Ref<const Eigen::Matrix<double, -1, 2>>, T1 = double, T2 = double]"
               );
}

Assistant:

void set_poles(Eigen::Ref<const Poles> poles)
    {
        if (poles.rows() != nb_poles() && poles.cols() != dimension()) {
            throw std::runtime_error("Invalid size");
        }

        m_poles = poles;
    }